

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_api.c
# Opt level: O1

int lua_setmetatable(lua_State *L,int idx)

{
  uint64_t uVar1;
  int iVar2;
  TValue *pTVar3;
  long lVar4;
  GCobj *v;
  GCobj *o;
  ulong uVar5;
  
  pTVar3 = index2adr(L,idx);
  v = (GCobj *)0x0;
  if (L->top[-1].u64 != 0xffffffffffffffff) {
    v = (GCobj *)(L->top[-1].u64 & 0x7fffffffffff);
  }
  uVar5 = pTVar3->u64;
  if ((long)uVar5 >> 0x2f == -0xd) {
    *(GCobj **)((uVar5 & 0x7fffffffffff) + 0x20) = v;
    if (((v != (GCobj *)0x0) && (((v->gch).marked & 3) != 0)) &&
       (((((GCobj *)(pTVar3->u64 & 0x7fffffffffff))->gch).marked & 4) != 0)) {
      lj_gc_barrierf((global_State *)(L->glref).ptr64,(GCobj *)(pTVar3->u64 & 0x7fffffffffff),v);
    }
  }
  else if ((long)uVar5 >> 0x2f == -0xc) {
    *(GCobj **)((uVar5 & 0x7fffffffffff) + 0x20) = v;
    if ((v != (GCobj *)0x0) && (((v->gch).marked & 3) != 0)) {
      uVar5 = pTVar3->u64 & 0x7fffffffffff;
      if ((*(byte *)(uVar5 + 8) & 4) != 0) {
        uVar1 = (L->glref).ptr64;
        *(byte *)(uVar5 + 8) = *(byte *)(uVar5 + 8) & 0xfb;
        *(undefined8 *)(uVar5 + 0x18) = *(undefined8 *)(uVar1 + 0x40);
        *(ulong *)(uVar1 + 0x40) = uVar5;
      }
    }
  }
  else {
    uVar1 = (L->glref).ptr64;
    iVar2 = lj_trace_flushall(L);
    if (iVar2 != 0) {
      lj_err_caller(L,LJ_ERR_NOGCMM);
    }
    uVar5 = pTVar3->it64 >> 0x2f;
    if (uVar5 + 3 < 2) {
      *(GCobj **)(uVar1 + 0x268) = v;
      *(GCobj **)(uVar1 + 0x260) = v;
    }
    else {
      lVar4 = 0x23;
      if (0xfffffffffffffff2 < uVar5) {
        lVar4 = 0x15 - uVar5;
      }
      *(GCobj **)(uVar1 + 0x1a8 + lVar4 * 8) = v;
    }
  }
  L->top = L->top + -1;
  return 1;
}

Assistant:

LUA_API int lua_setmetatable(lua_State *L, int idx)
{
  global_State *g;
  GCtab *mt;
  cTValue *o = index2adr_check(L, idx);
  lj_checkapi_slot(1);
  if (tvisnil(L->top-1)) {
    mt = NULL;
  } else {
    lj_checkapi(tvistab(L->top-1), "top stack slot is not a table");
    mt = tabV(L->top-1);
  }
  g = G(L);
  if (tvistab(o)) {
    setgcref(tabV(o)->metatable, obj2gco(mt));
    if (mt)
      lj_gc_objbarriert(L, tabV(o), mt);
  } else if (tvisudata(o)) {
    setgcref(udataV(o)->metatable, obj2gco(mt));
    if (mt)
      lj_gc_objbarrier(L, udataV(o), mt);
  } else {
    /* Flush cache, since traces specialize to basemt. But not during __gc. */
    if (lj_trace_flushall(L))
      lj_err_caller(L, LJ_ERR_NOGCMM);
    if (tvisbool(o)) {
      /* NOBARRIER: basemt is a GC root. */
      setgcref(basemt_it(g, LJ_TTRUE), obj2gco(mt));
      setgcref(basemt_it(g, LJ_TFALSE), obj2gco(mt));
    } else {
      /* NOBARRIER: basemt is a GC root. */
      setgcref(basemt_obj(g, o), obj2gco(mt));
    }
  }
  L->top--;
  return 1;
}